

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O2

size_t __thiscall Potassco::StringBuilder::size(StringBuilder *this)

{
  Buffer local_20;
  
  buffer(&local_20,this);
  return local_20.used;
}

Assistant:

std::size_t StringBuilder::size() const {
	return buffer().used;
}